

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

sFace * __thiscall gjkepa2_impl::EPA::findbest(EPA *this)

{
  float fVar1;
  btScalar sqd;
  sFace *f;
  btScalar mind;
  sFace *minf;
  EPA *this_local;
  
  minf = (this->m_hull).root;
  mind = minf->d * minf->d;
  for (f = minf->l[1]; f != (sFace *)0x0; f = f->l[1]) {
    fVar1 = f->d * f->d;
    if (fVar1 < mind) {
      minf = f;
      mind = fVar1;
    }
  }
  return minf;
}

Assistant:

sFace*				findbest()
			{
				sFace*		minf=m_hull.root;
				btScalar	mind=minf->d*minf->d;
				for(sFace* f=minf->l[1];f;f=f->l[1])
				{
					const btScalar	sqd=f->d*f->d;
					if(sqd<mind)
					{
						minf=f;
						mind=sqd;
					}
				}
				return(minf);
			}